

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::half>
          (Attribute *this,double t,half *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::half> v;
  optional<tinyusdz::value::half> local_38;
  optional<tinyusdz::value::half> local_34;
  double local_30;
  
  if (dst == (half *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_30 = t;
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    t = local_30;
    if (bVar1) {
      primvar::PrimVar::get_value<tinyusdz::value::half>(&local_38,&this->_var);
      local_34.has_value_ = local_38.has_value_;
      t = local_30;
      if (local_38.has_value_ != false) {
        local_34.contained = local_38.contained;
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_34);
        dst->value = pvVar2->value;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<tinyusdz::value::half>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::half>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }